

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_options(void)

{
  bool p_convert_strings;
  bool p_convert_strings_00;
  bool bVar1;
  bool p_convert_strings_01;
  bool p_convert_strings_02;
  bool p_convert_strings_03;
  bool p_convert_strings_04;
  json *pjVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined1 in_R10B;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j3;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j2;
  parser p;
  ifstream f;
  stream_reader r;
  
  std::ifstream::ifstream(&f,"test_files/test2.json",_S_in);
  argo::stream_reader::stream_reader(&r,(istream *)&f,100,true);
  argo::parser::parser(&p,&r.super_reader,true,0x19000,1000,true,(bool)in_R10B,p_convert_strings);
  argo::parser::parse((parser *)&j);
  std::operator<<((ostream *)jlog,"FAIL: message too long but parsed anyway\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
  std::ifstream::~ifstream(&f);
  std::ifstream::ifstream(&f,"test_files/test6.json",_S_in);
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser
            (&p,&r.super_reader,false,0x19000,1000,true,(bool)in_R10B,p_convert_strings_00);
  argo::parser::parse((parser *)&j);
  pjVar2 = argo::json::operator[]
                     ((json *)j._M_t.
                              super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                              .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,"one");
  bVar1 = argo::json::operator!=(pjVar2,1);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: first message broken\n");
  }
  argo::parser::parse((parser *)&j2);
  pjVar2 = argo::json::operator[]
                     ((json *)j2._M_t.
                              super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                              .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,"two");
  bVar1 = argo::json::operator!=(pjVar2,2);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: second message broken\n");
  }
  argo::parser::parse((parser *)&j3);
  pjVar2 = argo::json::operator[]
                     ((json *)j3._M_t.
                              super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                              .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,"three");
  bVar1 = argo::json::operator!=(pjVar2,3);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: third message broken\n");
  }
  std::operator<<((ostream *)jlog,"PASS: parsed three messages from file\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j3);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j2);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
  std::ifstream::~ifstream(&f);
  std::__cxx11::string::string((string *)&r,"99999999999999999999",(allocator *)&p);
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  std::__cxx11::string::~string((string *)&r);
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,1000,true,(bool)in_R10B,p_convert_strings_01);
  argo::parser::parse((parser *)&j);
  std::operator<<((ostream *)jlog,
                  "FAIL: int that was too large to be an int didn\'t cause an exception\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::__cxx11::string::string((string *)&r,"99999999999999999999.99",(allocator *)&p);
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  std::__cxx11::string::~string((string *)&r);
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,1000,false,(bool)in_R10B,p_convert_strings_02);
  argo::parser::parse((parser *)&j);
  psVar3 = argo::json::get_raw_value_abi_cxx11_
                     ((json *)j._M_t.
                              super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                              .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
  bVar1 = std::operator==(psVar3,"99999999999999999999.99");
  pcVar5 = "FAIL: don\'t convert number returned an incorrect raw value\n";
  if (bVar1) {
    pcVar5 = "PASS: don\'t convert number returned the correct raw value\n";
  }
  std::operator<<((ostream *)jlog,pcVar5);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::__cxx11::string::string((string *)&r,"\" lkjlkj lkjlkj \\x \\y \"",(allocator *)&p);
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  std::__cxx11::string::~string((string *)&r);
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,1000,true,(bool)in_R10B,p_convert_strings_03);
  argo::parser::parse((parser *)&j);
  psVar3 = argo::json::get_raw_value_abi_cxx11_
                     ((json *)j._M_t.
                              super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                              .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
  bVar1 = std::operator==(psVar3," lkjlkj lkjlkj \\x \\y ");
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: don\'t convert string returned the correct raw value\n");
  }
  else {
    poVar4 = std::operator<<((ostream *)jlog,
                             "FAIL: don\'t convert string returned an incorrect raw value:\'");
    psVar3 = argo::json::get_raw_value_abi_cxx11_
                       ((json *)j._M_t.
                                super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                                .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\'");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::__cxx11::string::string((string *)&r,"[[[[[[[[[[]]]]]]]]]]",(allocator *)&p);
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  std::__cxx11::string::~string((string *)&r);
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,9,true,(bool)in_R10B,p_convert_strings_04);
  argo::parser::parse((parser *)&j);
  std::operator<<((ostream *)jlog,"FAIL: nesting depth exceeded didn\'t cause exception\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  return;
}

Assistant:

void test_options()
{
    // test message length limit
    {
        try
        {
            ifstream f("test_files/test2.json");
            stream_reader r(&f, 100, true);
            parser p(r);
            auto j = p.parse();
            jlog << "FAIL: message too long but parsed anyway\n";
        }
        catch (json_io_exception &e)
        {
            if (e.get_type() == json_exception::message_too_long_e)
            {
                jlog << "PASS: message too long threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: message too long threw incorrect exception type\n";
            }
        }
    }

    // test reading more than one message from file (in byte read mode)
    {
        try
        {
            ifstream f("test_files/test6.json");
            stream_reader r(&f, 1000, false);
            parser p(r, false);
            auto j1 = p.parse();
            if ((*j1)["one"] != 1)
            {
                jlog << "FAIL: first message broken\n";
            }
            auto j2 = p.parse();
            if ((*j2)["two"] != 2)
            {
                jlog << "FAIL: second message broken\n";
            }
            auto j3 = p.parse();
            if ((*j3)["three"] != 3)
            {
                jlog << "FAIL: third message broken\n";
            }
            jlog << "PASS: parsed three messages from file\n";
        }
        catch (exception &e)
        {
            jlog << "FAIL: failed to parse three messages from file : " << e.what() << endl;
        }
    }

    // test don't fallback to doubles for large ints
    {
        try
        {
            istringstream is("99999999999999999999");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, true, false, true);
            auto j1 = p.parse();
            jlog << "FAIL: int that was too large to be an int didn't cause an exception\n";
        }
        catch (json_parser_exception &e)
        {
            if (e.get_type() == json_exception::number_out_of_range_e)
            {
                jlog << "PASS: int that was too large to be an int threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: int that was too large to be an int threw incorrect exception type\n";
            }
        }
    }

    // test don't convert numbers
    {
        try
        {
            istringstream is("99999999999999999999.99");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, false, true, true);
            auto j1 = p.parse();
            if (j1->get_raw_value() == "99999999999999999999.99")
            {
                jlog << "PASS: don't convert number returned the correct raw value\n";
            }
            else
            {
                jlog << "FAIL: don't convert number returned an incorrect raw value\n";
            }
        }
        catch (json_parser_exception &e)
        {
            jlog << "FAIL: don't convert number threw an exception\n";
        }
    }

    // test don't convert strings
    {
        try
        {
            istringstream is("\" lkjlkj lkjlkj \\x \\y \"");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, true, true, false);
            auto j1 = p.parse();
            if (j1->get_raw_value() == " lkjlkj lkjlkj \\x \\y ")
            {
                jlog << "PASS: don't convert string returned the correct raw value\n";
            }
            else
            {
                jlog << "FAIL: don't convert string returned an incorrect raw value:'" << j1->get_raw_value() << "'" << endl;
            }
        }
        catch (json_parser_exception &e)
        {
            jlog << "FAIL: don't convert string threw an exception\n";
        }
    }

    // test nesting depth limit
    {
        try
        {
            istringstream is("[[[[[[[[[[]]]]]]]]]]");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 9, true, true, true);
            auto j1 = p.parse();
            jlog << "FAIL: nesting depth exceeded didn't cause exception\n";
        }
        catch (json_parser_exception &e)
        {
            if (e.get_type() == json_exception::maximum_nesting_depth_exceeded_e)
            {
                jlog << "PASS: message nested too deeply threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: message nested too deeply threw incorrect exception type\n";
            }
        }
    }
}